

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

vmd_status_t dtime_clb(vmd_time_t dtime,void *_args)

{
  code *pcVar1;
  int iVar2;
  vmd_status_t vVar3;
  
  pcVar1 = *(code **)((long)_args + 0x18);
  iVar2 = vmd_map_get((vmd_map_t *)(*_args + 0x44210),*(vmd_time_t *)((long)_args + 8),
                      (vmd_time_t *)0x0);
  vVar3 = (*pcVar1)(dtime,iVar2,*(undefined8 *)((long)_args + 0x20));
  *(int *)((long)_args + 8) = *(int *)((long)_args + 8) + dtime;
  return vVar3;
}

Assistant:

static status_t
dtime_clb(time_t dtime, void *_args)
{
	struct file_play_args *args = _args;
	status_t ret = args->delay_clb(
		dtime,
		map_get(&args->file->ctrl[FCTRL_TEMPO], args->time, NULL),
		args->arg
	);
	args->time += dtime;
	return ret;
}